

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

Fad<double> * __thiscall
TPZMatrix<Fad<double>_>::MatrixNorm
          (Fad<double> *__return_storage_ptr__,TPZMatrix<Fad<double>_> *this,int p,int64_t numiter,
          REAL tol)

{
  Fad<double> *pFVar1;
  undefined4 uVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  bool bVar5;
  ostream *poVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  Fad<double> sum;
  TPZVec<Fad<double>_> EigenVal;
  TPZVec<Fad<double>_> ROW;
  TPZFMatrix<Fad<double>_> transp;
  double local_170;
  undefined1 local_168 [8];
  undefined1 local_160 [16];
  double *pdStack_150;
  double local_148;
  long local_140;
  REAL local_138;
  int64_t local_130;
  Fad<double> *local_128;
  TPZVec<Fad<double>_> local_120;
  TPZVec<Fad<double>_> local_100;
  Fad<double> local_e0;
  TPZFMatrix<Fad<double>_> local_c0;
  
  lVar13 = (this->super_TPZBaseMatrix).fRow;
  if (lVar13 != 0) {
    local_138 = tol;
    local_130 = numiter;
    if (lVar13 != (this->super_TPZBaseMatrix).fCol) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
                 ,0x53);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," - Cols() = ",0xc);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    if (p == 2) {
      local_128 = __return_storage_ptr__;
      TPZFMatrix<Fad<double>_>::TPZFMatrix(&local_c0,lVar13,lVar13);
      if (0 < lVar13) {
        lVar11 = 0;
        do {
          lVar14 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      ((Fad<double> *)local_168,this,lVar14,lVar11);
            pFVar3 = local_c0.fElem;
            if ((local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar11) ||
               (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar8 = local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar14;
            local_c0.fElem[lVar8 + lVar11].val_ = (double)local_168;
            Vector<double>::operator=
                      (&local_c0.fElem[lVar8 + lVar11].dx_,(Vector<double> *)local_160);
            pFVar3[lVar8 + lVar11].defaultVal = (double)pdStack_150;
            Fad<double>::~Fad((Fad<double> *)local_168);
            lVar14 = lVar14 + 1;
          } while (lVar13 != lVar14);
          lVar11 = lVar11 + 1;
        } while (lVar11 != lVar13);
      }
      TPZVec<Fad<double>_>::TPZVec(&local_100,lVar13);
      if (0 < lVar13) {
        lVar11 = 0;
        do {
          lVar8 = 0;
          lVar14 = 0;
          local_140 = lVar11;
          do {
            pFVar4 = local_c0.fElem;
            pFVar3 = local_100.fStore;
            if ((local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar14;
            pdVar7 = (double *)((long)&(local_100.fStore)->val_ + lVar8);
            *pdVar7 = local_c0.fElem[lVar9 + lVar11].val_;
            Vector<double>::operator=
                      ((Vector<double> *)(pdVar7 + 1),&local_c0.fElem[lVar9 + lVar11].dx_);
            *(double *)((long)&pFVar3->defaultVal + lVar8) = pFVar4[lVar9 + lVar11].defaultVal;
            lVar14 = lVar14 + 1;
            lVar8 = lVar8 + 0x20;
          } while (lVar13 != lVar14);
          lVar14 = 0;
          do {
            local_168 = (undefined1  [8])0x0;
            local_160._0_4_ = 0;
            local_160._8_8_ = (double *)0x0;
            pdStack_150 = (double *)0x0;
            lVar8 = 0;
            lVar9 = 0;
            do {
              pFVar3 = local_100.fStore;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                        (&local_e0,this,lVar9,lVar14);
              local_120._vptr_TPZVec = (_func_int **)((long)&pFVar3->val_ + lVar8);
              local_120.fStore = &local_e0;
              Fad<double>::operator+=
                        ((Fad<double> *)local_168,
                         (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_120);
              Fad<double>::~Fad(&local_e0);
              pFVar3 = local_c0.fElem;
              lVar9 = lVar9 + 1;
              lVar8 = lVar8 + 0x20;
            } while (lVar13 != lVar9);
            if ((local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar8 = local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar14;
            local_c0.fElem[lVar8 + lVar11].val_ = (double)local_168;
            Vector<double>::operator=
                      (&local_c0.fElem[lVar8 + lVar11].dx_,(Vector<double> *)local_160);
            pFVar3[lVar8 + lVar11].defaultVal = (double)pdStack_150;
            Fad<double>::~Fad((Fad<double> *)local_168);
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar13);
          lVar11 = local_140 + 1;
        } while (lVar11 != lVar13);
      }
      local_120._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
      local_120.fStore = (Fad<double> *)0x0;
      local_120.fNElements = 0;
      local_120.fNAlloc = 0;
      bVar5 = SolveEigenvaluesJacobi
                        (&local_c0.super_TPZMatrix<Fad<double>_>,&local_130,&local_138,&local_120);
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
                   ,0x53);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," - it was not possible to find Eigenvalues. Iterations = "
                   ,0x39);
        poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," - error found = ",0x11);
        poVar6 = std::ostream::_M_insert<double>(local_138);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      FadFuncSqrt<Fad<double>_>::FadFuncSqrt
                ((FadFuncSqrt<Fad<double>_> *)&local_e0,local_120.fStore);
      pFVar3 = local_128;
      FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_168,
                 (FadFuncSqrt<Fad<double>_> *)&local_e0);
      Fad<double>::~Fad(&local_e0);
      dVar15 = (double)CONCAT44(local_160._4_4_,local_160._0_4_);
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      pFVar3->val_ = dVar15;
      uVar2 = local_160._8_4_;
      (pFVar3->dx_).num_elts = 0;
      (pFVar3->dx_).ptr_to_data = (double *)0x0;
      if ((long)(int)local_160._8_4_ < 1) {
        pFVar3->defaultVal = 0.0;
      }
      else {
        (pFVar3->dx_).num_elts = local_160._8_4_;
        uVar10 = (long)(int)local_160._8_4_ << 3;
        pdVar7 = (double *)operator_new__(uVar10);
        (pFVar3->dx_).ptr_to_data = pdVar7;
        pFVar3->defaultVal = 0.0;
        if (0 < (int)uVar2) {
          uVar12 = 0;
          do {
            pdVar7 = (double *)((long)pdStack_150 + uVar12);
            if (local_160._8_4_ == 0) {
              pdVar7 = &local_148;
            }
            dVar15 = *pdVar7;
            dVar16 = (double)CONCAT44(local_160._4_4_,local_160._0_4_);
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            *(double *)((long)(pFVar3->dx_).ptr_to_data + uVar12) = dVar15 / (dVar16 + dVar16);
            uVar12 = uVar12 + 8;
          } while (uVar10 != uVar12);
        }
      }
      Fad<double>::~Fad((Fad<double> *)local_160);
      pFVar4 = local_120.fStore;
      local_120._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
      if (local_120.fStore != (Fad<double> *)0x0) {
        pFVar1 = local_120.fStore + -1;
        dVar15 = local_120.fStore[-1].defaultVal;
        if (dVar15 != 0.0) {
          lVar13 = (long)dVar15 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&pFVar4[-1].val_ + lVar13));
            lVar13 = lVar13 + -0x20;
          } while (lVar13 != 0);
        }
        operator_delete__(&pFVar1->defaultVal,(long)dVar15 << 5 | 8);
      }
      local_100._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
      if (local_100.fStore != (Fad<double> *)0x0) {
        dVar15 = local_100.fStore[-1].defaultVal;
        if (dVar15 != 0.0) {
          lVar13 = (long)dVar15 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&local_100.fStore[-1].val_ + lVar13));
            lVar13 = lVar13 + -0x20;
          } while (lVar13 != 0);
        }
        operator_delete__(&local_100.fStore[-1].defaultVal,(long)dVar15 << 5 | 8);
      }
      TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_c0);
      return pFVar3;
    }
    if (p == 1) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar13 < 1) {
        return __return_storage_ptr__;
      }
      lVar11 = 0;
      do {
        local_170 = 0.0;
        lVar14 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_c0,this,lVar14,lVar11);
          local_170 = local_170 +
                      ABS((double)local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
                                  super_TPZSavable._vptr_TPZSavable);
          Fad<double>::~Fad((Fad<double> *)&local_c0);
          lVar14 = lVar14 + 1;
        } while (lVar13 != lVar14);
        if ((ABS(__return_storage_ptr__->val_) < local_170) &&
           (__return_storage_ptr__->val_ = local_170, (__return_storage_ptr__->dx_).num_elts != 0))
        {
          local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable = (_func_int **)0x0;
          Vector<double>::operator=(&__return_storage_ptr__->dx_,(double *)&local_c0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar13);
      return __return_storage_ptr__;
    }
    if (p == 0) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar13 < 1) {
        return __return_storage_ptr__;
      }
      lVar11 = 0;
      do {
        local_170 = 0.0;
        lVar14 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_c0,this,lVar11,lVar14);
          local_170 = local_170 +
                      ABS((double)local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
                                  super_TPZSavable._vptr_TPZSavable);
          Fad<double>::~Fad((Fad<double> *)&local_c0);
          lVar14 = lVar14 + 1;
        } while (lVar13 != lVar14);
        if ((ABS(__return_storage_ptr__->val_) < local_170) &&
           (__return_storage_ptr__->val_ = local_170, (__return_storage_ptr__->dx_).num_elts != 0))
        {
          local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable = (_func_int **)0x0;
          Vector<double>::operator=(&__return_storage_ptr__->dx_,(double *)&local_c0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar13);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
               ,0x53);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," p = ",5);
    poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not a correct option",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  __return_storage_ptr__->val_ = 0.0;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  __return_storage_ptr__->defaultVal = 0.0;
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}